

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *p_j2k,opj_image_t *p_image)

{
  opj_image_comp_t *poVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  uint uVar10;
  opj_image_comp_t *poVar11;
  OPJ_INT32 **ppOVar12;
  opj_image_comp_t *poVar13;
  OPJ_BOOL OVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  
  uVar15 = (ulong)(p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
  if (uVar15 == 0) {
    OVar14 = 1;
    if (p_image->numcomps != 0) {
      poVar11 = p_j2k->m_output_image->comps;
      poVar13 = p_image->comps;
      lVar17 = 0;
      uVar15 = 0;
      do {
        *(undefined4 *)((long)&poVar13->resno_decoded + lVar17) =
             *(undefined4 *)((long)&poVar11->resno_decoded + lVar17);
        opj_image_data_free(*(void **)((long)&poVar13->data + lVar17));
        poVar11 = p_j2k->m_output_image->comps;
        poVar13 = p_image->comps;
        *(undefined8 *)((long)&poVar13->data + lVar17) =
             *(undefined8 *)((long)&poVar11->data + lVar17);
        *(undefined8 *)((long)&poVar11->data + lVar17) = 0;
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0x40;
      } while (uVar15 < p_image->numcomps);
    }
  }
  else {
    poVar11 = (opj_image_comp_t *)opj_malloc(uVar15 << 6);
    if (poVar11 == (opj_image_comp_t *)0x0) {
      opj_image_destroy(p_j2k->m_private_image);
      p_j2k->m_private_image = (opj_image_t *)0x0;
      OVar14 = 0;
    }
    else {
      uVar16 = 0;
      uVar10 = 0;
      if (p_image->numcomps != 0) {
        poVar13 = p_image->comps;
        lVar17 = 0x30;
        uVar15 = 0;
        do {
          opj_image_data_free(*(void **)((long)&poVar13->dx + lVar17));
          poVar13 = p_image->comps;
          *(undefined8 *)((long)&poVar13->dx + lVar17) = 0;
          uVar15 = uVar15 + 1;
          uVar10 = p_image->numcomps;
          lVar17 = lVar17 + 0x40;
        } while (uVar15 < uVar10);
      }
      if ((p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode != 0) {
        poVar13 = p_j2k->m_output_image->comps;
        ppOVar12 = &poVar11->data;
        uVar15 = 0;
        do {
          uVar10 = (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode[uVar15];
          poVar1 = poVar13 + uVar10;
          OVar8 = poVar1->dx;
          OVar9 = poVar1->dy;
          uVar2 = *(undefined8 *)&poVar1->w;
          uVar3 = *(undefined8 *)&poVar13[uVar10].x0;
          uVar4 = *(undefined8 *)(&poVar13[uVar10].x0 + 2);
          uVar5 = *(undefined8 *)&poVar13[uVar10].sgnd;
          uVar6 = *(undefined8 *)(&poVar13[uVar10].sgnd + 2);
          uVar7 = (&poVar13[uVar10].data)[1];
          *ppOVar12 = poVar13[uVar10].data;
          ppOVar12[1] = (OPJ_INT32 *)uVar7;
          ppOVar12[-2] = (OPJ_INT32 *)uVar5;
          ppOVar12[-1] = (OPJ_INT32 *)uVar6;
          ppOVar12[-4] = (OPJ_INT32 *)uVar3;
          ppOVar12[-3] = (OPJ_INT32 *)uVar4;
          ((opj_image_comp_t *)(ppOVar12 + -6))->dx = OVar8;
          ((opj_image_comp_t *)(ppOVar12 + -6))->dy = OVar9;
          ppOVar12[-5] = (OPJ_INT32 *)uVar2;
          poVar13 = p_j2k->m_output_image->comps;
          *(OPJ_UINT32 *)((long)ppOVar12 + -0xc) = poVar13[uVar10].resno_decoded;
          *ppOVar12 = poVar13[uVar10].data;
          poVar13[uVar10].data = (OPJ_INT32 *)0x0;
          uVar15 = uVar15 + 1;
          uVar16 = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
          ppOVar12 = ppOVar12 + 8;
        } while (uVar15 < uVar16);
        uVar10 = p_image->numcomps;
      }
      if (uVar10 != 0) {
        poVar13 = p_j2k->m_output_image->comps;
        lVar17 = 0x30;
        uVar15 = 0;
        do {
          if (*(long *)((long)&poVar13->dx + lVar17) != 0) {
            __assert_fail("p_j2k->m_output_image->comps[compno].data == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                          ,0x2eb9,
                          "OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *, opj_image_t *)"
                         );
          }
          opj_image_data_free((void *)0x0);
          poVar13 = p_j2k->m_output_image->comps;
          *(undefined8 *)((long)&poVar13->dx + lVar17) = 0;
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 0x40;
        } while (uVar15 < p_image->numcomps);
        uVar16 = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
      }
      p_image->numcomps = uVar16;
      opj_free(p_image->comps);
      p_image->comps = poVar11;
      OVar14 = 1;
    }
  }
  return OVar14;
}

Assistant:

static OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t * p_j2k,
        opj_image_t * p_image)
{
    OPJ_UINT32 compno;

    /* Move data and copy one information from codec to output image*/
    if (p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode > 0) {
        opj_image_comp_t* newcomps =
            (opj_image_comp_t*) opj_malloc(
                p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode *
                sizeof(opj_image_comp_t));
        if (newcomps == NULL) {
            opj_image_destroy(p_j2k->m_private_image);
            p_j2k->m_private_image = NULL;
            return OPJ_FALSE;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = NULL;
        }
        for (compno = 0;
                compno < p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode; compno++) {
            OPJ_UINT32 src_compno =
                p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode[compno];
            memcpy(&(newcomps[compno]),
                   &(p_j2k->m_output_image->comps[src_compno]),
                   sizeof(opj_image_comp_t));
            newcomps[compno].resno_decoded =
                p_j2k->m_output_image->comps[src_compno].resno_decoded;
            newcomps[compno].data = p_j2k->m_output_image->comps[src_compno].data;
            p_j2k->m_output_image->comps[src_compno].data = NULL;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            assert(p_j2k->m_output_image->comps[compno].data == NULL);
            opj_image_data_free(p_j2k->m_output_image->comps[compno].data);
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
        p_image->numcomps = p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode;
        opj_free(p_image->comps);
        p_image->comps = newcomps;
    } else {
        for (compno = 0; compno < p_image->numcomps; compno++) {
            p_image->comps[compno].resno_decoded =
                p_j2k->m_output_image->comps[compno].resno_decoded;
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;
#if 0
            char fn[256];
            sprintf(fn, "/tmp/%d.raw", compno);
            FILE *debug = fopen(fn, "wb");
            fwrite(p_image->comps[compno].data, sizeof(OPJ_INT32),
                   p_image->comps[compno].w * p_image->comps[compno].h, debug);
            fclose(debug);
#endif
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
    }
    return OPJ_TRUE;
}